

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

STRING_HANDLE STRING_new(void)

{
  STRING_HANDLE __ptr;
  char *pcVar1;
  LOGGER_LOG p_Var2;
  
  __ptr = (STRING_HANDLE)malloc(8);
  if (__ptr != (STRING_HANDLE)0x0) {
    pcVar1 = (char *)malloc(1);
    __ptr->s = pcVar1;
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
      return __ptr;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                ,"STRING_new",0x25,1,"Failure allocating in STRING_new.");
    }
    free(__ptr);
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE STRING_new(void)
{
    STRING* result;
    if ((result = (STRING*)malloc(sizeof(STRING))) != NULL)
    {
        if ((result->s = (char*)malloc(1)) != NULL)
        {
            result->s[0] = '\0';
        }
        else
        {
            /* Codes_SRS_STRING_07_002: [STRING_new shall return an NULL STRING_HANDLE on any error that is encountered.] */
            LogError("Failure allocating in STRING_new.");
            free(result);
            result = NULL;
        }
    }
    return (STRING_HANDLE)result;
}